

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *brand)

{
  ListElementCount LVar1;
  ElementCount index;
  ElementCount index_00;
  bool bVar2;
  Reader binding;
  Reader scope;
  Fault f;
  Reader type;
  ListReader local_90;
  ListReader local_60;
  
  bVar2 = (brand->_reader).pointerCount == 0;
  scope._reader.data = (brand->_reader).pointers;
  if (bVar2) {
    scope._reader.data = (WirePointer *)0x0;
  }
  scope._reader.pointers._0_4_ = 0x7fffffff;
  if (!bVar2) {
    scope._reader.pointers._0_4_ = (brand->_reader).nestingLimit;
  }
  scope._reader.segment._0_4_ = 0;
  scope._reader.segment._4_4_ = 0;
  scope._reader.capTable._0_4_ = 0;
  scope._reader.capTable._4_4_ = 0;
  if (!bVar2) {
    scope._reader.segment._0_4_ = *(undefined4 *)&(brand->_reader).segment;
    scope._reader.segment._4_4_ = *(undefined4 *)((long)&(brand->_reader).segment + 4);
    scope._reader.capTable._0_4_ = *(undefined4 *)&(brand->_reader).capTable;
    scope._reader.capTable._4_4_ = *(undefined4 *)((long)&(brand->_reader).capTable + 4);
  }
  _::PointerReader::getList(&local_60,(PointerReader *)&scope,INLINE_COMPOSITE,(word *)0x0);
  if (local_60.elementCount != 0) {
    index = 0;
    do {
      _::ListReader::getStructElement(&scope._reader,&local_60,index);
      if ((scope._reader.dataSize < 0x50) || (*(short *)((long)scope._reader.data + 8) == 0)) {
        binding._reader.pointers._0_4_ = scope._reader.nestingLimit;
        binding._reader.data =
             (void *)CONCAT44(scope._reader.pointers._4_4_,(int)scope._reader.pointers);
        if (scope._reader.pointerCount == 0) {
          binding._reader.pointers._0_4_ = 0x7fffffff;
          binding._reader.data = (void *)0x0;
        }
        binding._reader.segment._0_4_ = 0;
        binding._reader.segment._4_4_ = 0;
        binding._reader.capTable._0_4_ = 0;
        binding._reader.capTable._4_4_ = 0;
        if (scope._reader.pointerCount != 0) {
          binding._reader.segment._0_4_ = scope._reader.segment._0_4_;
          binding._reader.segment._4_4_ = scope._reader.segment._4_4_;
          binding._reader.capTable._0_4_ = scope._reader.capTable._0_4_;
          binding._reader.capTable._4_4_ = scope._reader.capTable._4_4_;
        }
        _::PointerReader::getList
                  (&local_90,(PointerReader *)&binding._reader,INLINE_COMPOSITE,(word *)0x0);
        LVar1 = local_90.elementCount;
        if (local_90.elementCount != 0) {
          index_00 = 0;
          do {
            _::ListReader::getStructElement(&binding._reader,&local_90,index_00);
            if ((0xf < binding._reader.dataSize) && (*binding._reader.data == 1)) {
              f.exception._0_4_ = 0;
              f.exception._4_4_ = 0;
              if (binding._reader.pointerCount != 0) {
                f.exception._0_4_ = binding._reader.segment._0_4_;
                f.exception._4_4_ = binding._reader.segment._4_4_;
              }
              _::PointerReader::getStruct(&type._reader,(PointerReader *)&f,(word *)0x0);
              validate(this,(Reader *)&type._reader);
              if ((type._reader.dataSize < 0x10) ||
                 ((*type._reader.data < 0x10 && ((0x8fffU >> (*type._reader.data & 0x1f) & 1) != 0))
                 )) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,char_const(&)[46],capnp::schema::Type::Reader&>
                          (&f,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                           ,0x24a,FAILED,"isPointer",
                           "\"generic type parameter must be a pointer type\", type",
                           (char (*) [46])"generic type parameter must be a pointer type",&type);
                this->isValid = false;
                kj::_::Debug::Fault::~Fault(&f);
                return;
              }
            }
            index_00 = index_00 + 1;
          } while (LVar1 != index_00);
        }
      }
      index = index + 1;
    } while (index != local_60.elementCount);
  }
  return;
}

Assistant:

void validate(const schema::Brand::Reader& brand) {
    for (auto scope: brand.getScopes()) {
      switch (scope.which()) {
        case schema::Brand::Scope::BIND:
          for (auto binding: scope.getBind()) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND:
                break;
              case schema::Brand::Binding::TYPE: {
                auto type = binding.getType();
                validate(type);
                bool isPointer = true;
                switch (type.which()) {
                  case schema::Type::VOID:
                  case schema::Type::BOOL:
                  case schema::Type::INT8:
                  case schema::Type::INT16:
                  case schema::Type::INT32:
                  case schema::Type::INT64:
                  case schema::Type::UINT8:
                  case schema::Type::UINT16:
                  case schema::Type::UINT32:
                  case schema::Type::UINT64:
                  case schema::Type::FLOAT32:
                  case schema::Type::FLOAT64:
                  case schema::Type::ENUM:
                    isPointer = false;
                    break;

                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::ANY_POINTER:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::LIST:
                    isPointer = true;
                    break;
                }
                VALIDATE_SCHEMA(isPointer,
                    "generic type parameter must be a pointer type", type);

                break;
              }
            }
          }
          break;
        case schema::Brand::Scope::INHERIT:
          break;
      }
    }
  }